

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void addreloc(Section *sec,Reloc *r,uint16_t pos,uint16_t siz,lword mask)

{
  RelocInsert *pRVar1;
  node *in_RSI;
  long in_RDI;
  RelocInsert *new;
  RelocInsert *ri;
  uint16_t in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  RelocInsert *in_stack_ffffffffffffffd0;
  node *local_28;
  
  pRVar1 = initRelocInsert(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
                           in_stack_ffffffffffffffcc,0x115701);
  local_28 = in_RSI[3].next;
  if (local_28 == (node *)0x0) {
    in_RSI[3].next = (node *)pRVar1;
  }
  else {
    for (; local_28->next != (node *)0x0; local_28 = local_28->next) {
    }
    local_28->next = (node *)pRVar1;
  }
  if ((in_RSI->next == (node *)0x0) && (in_RDI != 0)) {
    if (in_RSI[1].next == (node *)0x0) {
      addtail((list *)(in_RDI + 0x60),in_RSI);
    }
    else {
      addtail((list *)(in_RDI + 0x78),in_RSI);
    }
  }
  return;
}

Assistant:

void addreloc(struct Section *sec,struct Reloc *r,
              uint16_t pos,uint16_t siz,lword mask)
/* Add a relocation description of the current type to this relocation,
   which will be inserted into the sections reloc list, if not
   already done. */
{
  struct RelocInsert *ri,*new;

  new = initRelocInsert(NULL,pos,siz,mask);
  if (ri = r->insert) {
    while (ri->next)
      ri = ri->next;
    ri->next = new;
  }
  else
    r->insert = new;

  if (r->n.next==NULL && sec!=NULL) {
    if (r->xrefname)
      addtail(&sec->xrefs,&r->n);  /* add to current section's XRef list */
    else
      addtail(&sec->relocs,&r->n);  /* add to current section's Reloc list */
  }
}